

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::Image(Texture *texture,Vector2f *size,Color *tintColor,Color *borderColor)

{
  uint uVar1;
  ImVec2 local_68;
  ImVec2 local_60;
  Vector2f local_58;
  ImVec4 local_50;
  ImVec4 local_40;
  
  uVar1 = sf::Texture::getNativeHandle(texture);
  local_58 = *size;
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_68.x = 1.0;
  local_68.y = 1.0;
  local_40 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*tintColor);
  local_50 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*borderColor);
  Image((ImTextureID)(ulong)uVar1,(ImVec2 *)&local_58,&local_60,&local_68,&local_40,&local_50);
  return;
}

Assistant:

void Image(const sf::Texture& texture, const sf::Vector2f& size, const sf::Color& tintColor,
           const sf::Color& borderColor) {
    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());

    ImGui::Image(textureID, ImVec2(size.x, size.y), ImVec2(0, 0), ImVec2(1, 1),
                 toImColor(tintColor), toImColor(borderColor));
}